

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_module(lysp_yang_ctx *ctx,lysp_module *mod)

{
  lyd_node *plVar1;
  lys_module *plVar2;
  uint uVar3;
  LY_ERR LVar4;
  lysp_submodule *plVar5;
  char *pcVar6;
  char *pcVar7;
  uint32_t parent_stmt_index;
  char *format;
  ly_stmt stmt;
  ly_stmt lVar8;
  LY_VECODE code;
  ly_ctx *plVar9;
  lysp_module *plVar10;
  ly_stmt any_kw;
  char **value;
  bool bVar11;
  lysp_ext_instance **in_stack_ffffffffffffff30;
  ly_stmt kw;
  lysp_ext_instance **local_b8;
  lysp_node **local_b0;
  char *word;
  size_t word_len;
  lysp_include **local_98;
  lysp_import **local_90;
  lysp_node_augment **local_88;
  lysp_deviation **local_80;
  lysp_ext **local_78;
  lysp_feature **local_70;
  lysp_node_grp **local_68;
  lysp_ident **local_60;
  lysp_node_notif **local_58;
  lysp_node_action **local_50;
  lysp_tpdf **local_48;
  lysp_revision **local_40;
  char *buf;
  
  mod->field_0x79 = mod->field_0x79 & 0xfd;
  LVar4 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&word,&buf,&word_len);
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  if (buf == (char *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar9 = (ly_ctx *)0x0;
    }
    else {
      plVar9 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar6 = word;
    if (word_len == 0) {
      pcVar6 = "";
    }
    LVar4 = lydict_insert(plVar9,pcVar6,word_len,&mod->mod->name);
  }
  else {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar9 = (ly_ctx *)0x0;
    }
    else {
      plVar9 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar4 = lydict_insert_zc(plVar9,word,&mod->mod->name);
  }
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  LVar4 = get_keyword(ctx,&kw,&word,&word_len);
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  if (kw == LY_STMT_SYNTAX_SEMICOLON) {
    bVar11 = false;
  }
  else {
    if (kw != LY_STMT_SYNTAX_LEFT_BRACE) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar9 = (ly_ctx *)0x0;
      }
      else {
        plVar9 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar6 = lyplg_ext_stmt2str(kw);
      ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\", expected \";\" or \"{\"."
              ,pcVar6);
      return LY_EVALID;
    }
    LVar4 = get_keyword(ctx,&kw,&word,&word_len);
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    bVar11 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
  }
  uVar3 = 0;
  local_b8 = &mod->exts;
  local_48 = &mod->typedefs;
  local_50 = &mod->rpcs;
  local_58 = &mod->notifs;
  local_60 = &mod->identities;
  local_68 = &mod->groupings;
  local_70 = &mod->features;
  local_78 = &mod->extensions;
  local_80 = &mod->deviations;
  local_88 = &mod->augments;
  local_b0 = &mod->data;
  local_40 = &mod->revs;
  local_90 = &mod->imports;
  local_98 = &mod->includes;
  lVar8 = kw;
  stmt = LY_STMT_NONE;
  do {
    any_kw = lVar8;
    if (!bVar11) {
      plVar2 = mod->mod;
      if (plVar2->ns == (char *)0x0) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar9 = (ly_ctx *)0x0;
        }
        else {
          plVar9 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        format = "Missing mandatory keyword \"%s\" as a child of \"%s\".";
        pcVar6 = "namespace";
      }
      else {
        if (plVar2->prefix != (char *)0x0) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar9 = (ly_ctx *)0x0;
          }
          else {
            plVar9 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          plVar5 = ly_ctx_get_submodule_latest(plVar9,plVar2->name);
          if (plVar5 == (lysp_submodule *)0x0) {
            return LY_SUCCESS;
          }
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar9 = (ly_ctx *)0x0;
          }
          else {
            plVar9 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          format = "Name collision between %s and %s of name \"%s\".";
          pcVar6 = "module";
          pcVar7 = "submodule";
          code = LYVE_SEMANTICS;
          goto LAB_00176711;
        }
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar9 = (ly_ctx *)0x0;
        }
        else {
          plVar9 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        format = "Missing mandatory keyword \"%s\" as a child of \"%s\".";
        pcVar6 = "prefix";
      }
LAB_00176705:
      pcVar7 = "module";
      code = LYVE_SYNTAX_YANG;
LAB_00176711:
      ly_vlog(plVar9,(char *)0x0,code,format,pcVar6,pcVar7);
      return LY_EVALID;
    }
    if ((((((any_kw - LY_STMT_NOTIFICATION < 0x40) &&
           ((0x8000000080008001U >> ((ulong)(any_kw - LY_STMT_NOTIFICATION) & 0x3f) & 1) != 0)) ||
          (any_kw == LY_STMT_AUGMENT)) ||
         ((any_kw == LY_STMT_CHOICE || (any_kw == LY_STMT_CONTAINER)))) ||
        ((any_kw == LY_STMT_GROUPING || ((any_kw == LY_STMT_LEAF || (any_kw == LY_STMT_LEAF_LIST))))
        )) || ((any_kw == LY_STMT_LIST || (any_kw == LY_STMT_USES)))) {
LAB_001760ad:
      uVar3 = 4;
      goto LAB_001760d3;
    }
    if ((any_kw == LY_STMT_CONTACT) || (any_kw == LY_STMT_DESCRIPTION)) goto LAB_001760b7;
    if ((any_kw == LY_STMT_DEVIATION) ||
       (((any_kw == LY_STMT_EXTENSION || (any_kw == LY_STMT_FEATURE)) ||
        (any_kw == LY_STMT_IDENTITY)))) goto LAB_001760ad;
    if ((any_kw == LY_STMT_IMPORT) || (any_kw == LY_STMT_INCLUDE)) {
      bVar11 = uVar3 < 2;
      uVar3 = 1;
LAB_001760c7:
      if (!bVar11) {
LAB_00176617:
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar9 = (ly_ctx *)0x0;
        }
        else {
          plVar9 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
LAB_001766a9:
        pcVar6 = lyplg_ext_stmt2str(any_kw);
        pcVar7 = lyplg_ext_stmt2str(stmt);
        format = "Invalid keyword \"%s\", it cannot appear after \"%s\".";
        code = LYVE_SYNTAX_YANG;
        goto LAB_00176711;
      }
LAB_001760d3:
      if (any_kw == LY_STMT_NOTIFICATION) {
        LVar4 = parse_notif(ctx,(lysp_node *)0x0,local_58);
      }
      else if (any_kw == LY_STMT_RPC) {
        LVar4 = parse_action(ctx,(lysp_node *)0x0,local_50);
      }
      else {
        if (any_kw == LY_STMT_ANYDATA) {
          plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          if (*(byte *)&plVar1[2].schema < 2) {
            plVar9 = (ly_ctx *)**(undefined8 **)plVar1;
            format = 
            "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
            ;
            pcVar6 = "anydata";
            goto LAB_00176705;
          }
        }
        else if (any_kw != LY_STMT_ANYXML) {
          if (any_kw == LY_STMT_AUGMENT) {
            LVar4 = parse_augment(ctx,(lysp_node *)0x0,local_88);
          }
          else if (any_kw == LY_STMT_CHOICE) {
            LVar4 = parse_choice(ctx,(lysp_node *)0x0,local_b0);
          }
          else if (any_kw == LY_STMT_CONTAINER) {
            LVar4 = parse_container(ctx,(lysp_node *)0x0,local_b0);
          }
          else if (any_kw == LY_STMT_GROUPING) {
            LVar4 = parse_grouping(ctx,(lysp_node *)0x0,local_68);
          }
          else if (any_kw == LY_STMT_LEAF) {
            LVar4 = parse_leaf(ctx,(lysp_node *)0x0,local_b0);
          }
          else if (any_kw == LY_STMT_LEAF_LIST) {
            LVar4 = parse_leaflist(ctx,(lysp_node *)0x0,local_b0);
          }
          else if (any_kw == LY_STMT_LIST) {
            LVar4 = parse_list(ctx,(lysp_node *)0x0,local_b0);
          }
          else if (any_kw == LY_STMT_USES) {
            LVar4 = parse_uses(ctx,(lysp_node *)0x0,local_b0);
          }
          else {
            plVar10 = mod;
            if (any_kw == LY_STMT_CONTACT) {
              parent_stmt_index = (int)mod->mod + 0x38;
              lVar8 = LY_STMT_CONTACT;
LAB_001764b0:
              value = (char **)0x2;
            }
            else {
              if (any_kw == LY_STMT_DESCRIPTION) {
                parent_stmt_index = (int)mod->mod + 0x40;
                lVar8 = LY_STMT_DESCRIPTION;
                plVar10 = (lysp_module *)mod->mod->dsc;
                goto LAB_001764b0;
              }
              if (any_kw == LY_STMT_DEVIATION) {
                LVar4 = parse_deviation(ctx,local_80);
                goto LAB_001764bc;
              }
              if (any_kw == LY_STMT_EXTENSION) {
                LVar4 = parse_extension(ctx,local_78);
                goto LAB_001764bc;
              }
              if (any_kw == LY_STMT_EXTENSION_INSTANCE) {
                LVar4 = parse_ext(ctx,word,word_len,mod,LY_STMT_MODULE,0,local_b8);
                goto LAB_001764bc;
              }
              if (any_kw == LY_STMT_FEATURE) {
                LVar4 = parse_feature(ctx,local_70);
                goto LAB_001764bc;
              }
              if (any_kw == LY_STMT_IDENTITY) {
                LVar4 = parse_identity(ctx,local_60);
                goto LAB_001764bc;
              }
              if (any_kw == LY_STMT_IMPORT) {
                LVar4 = parse_import(ctx,mod->mod->prefix,local_90);
                goto LAB_001764bc;
              }
              if (any_kw == LY_STMT_INCLUDE) {
                LVar4 = parse_include(ctx,mod->mod->name,local_98);
                goto LAB_001764bc;
              }
              if (any_kw == LY_STMT_NAMESPACE) {
                parent_stmt_index = (int)mod->mod + 0x18;
                lVar8 = LY_STMT_NAMESPACE;
                goto LAB_001764b0;
              }
              if (any_kw == LY_STMT_ORGANIZATION) {
                parent_stmt_index = (int)mod->mod + 0x30;
                lVar8 = LY_STMT_ORGANIZATION;
                goto LAB_001764b0;
              }
              if (any_kw != LY_STMT_PREFIX) {
                if (any_kw != LY_STMT_REFERENCE) {
                  if (any_kw == LY_STMT_REVISION) goto LAB_00176268;
                  if (any_kw != LY_STMT_TYPEDEF) {
                    if (any_kw != LY_STMT_YANG_VERSION) {
                      if (ctx == (lysp_yang_ctx *)0x0) {
                        plVar9 = (ly_ctx *)0x0;
                      }
                      else {
                        plVar9 = (ly_ctx *)
                                 **(undefined8 **)
                                   (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                      }
                      pcVar6 = lyplg_ext_stmt2str(any_kw);
                      format = "Invalid keyword \"%s\" as a child of \"%s\".";
                      pcVar7 = "module";
                      code = LYVE_SYNTAX_YANG;
                      goto LAB_00176711;
                    }
                    goto LAB_00176245;
                  }
                  LVar4 = parse_typedef(ctx,(lysp_node *)0x0,local_48);
                  goto LAB_001764bc;
                }
                parent_stmt_index = (int)mod->mod + 0x48;
                lVar8 = LY_STMT_REFERENCE;
                plVar10 = (lysp_module *)mod->mod->ref;
                goto LAB_001764b0;
              }
              plVar10 = (lysp_module *)mod->mod->prefix;
              parent_stmt_index = (int)mod->mod + 0x20;
              lVar8 = LY_STMT_PREFIX;
              value = (char **)0x0;
            }
            LVar4 = parse_text_field(ctx,plVar10,lVar8,parent_stmt_index,value,Y_IDENTIF_ARG,
                                     (uint16_t *)local_b8,in_stack_ffffffffffffff30);
          }
          goto LAB_001764bc;
        }
        LVar4 = parse_any(ctx,any_kw,(lysp_node *)0x0,local_b0);
      }
    }
    else {
      if (any_kw == LY_STMT_NAMESPACE) {
LAB_00176083:
        bVar11 = uVar3 != 0;
        uVar3 = 0;
        if (bVar11) goto LAB_00176617;
        goto LAB_001760d3;
      }
      if (any_kw == LY_STMT_ORGANIZATION) {
LAB_001760b7:
        bVar11 = uVar3 < 3;
        uVar3 = 2;
        goto LAB_001760c7;
      }
      if (any_kw == LY_STMT_YANG_VERSION) {
        bVar11 = uVar3 != 0;
        uVar3 = 0;
        if (bVar11) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar9 = (ly_ctx *)0x0;
          }
          else {
            plVar9 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          any_kw = LY_STMT_YANG_VERSION;
          goto LAB_001766a9;
        }
LAB_00176245:
        LVar4 = parse_yangversion(ctx,mod);
      }
      else {
        if (any_kw == LY_STMT_REFERENCE) goto LAB_001760b7;
        if (any_kw != LY_STMT_REVISION) {
          if (any_kw == LY_STMT_TYPEDEF) goto LAB_001760ad;
          if (any_kw == LY_STMT_PREFIX) goto LAB_00176083;
          goto LAB_001760d3;
        }
        bVar11 = 3 < uVar3;
        uVar3 = 3;
        if (bVar11) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar9 = (ly_ctx *)0x0;
          }
          else {
            plVar9 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          any_kw = LY_STMT_REVISION;
          goto LAB_001766a9;
        }
LAB_00176268:
        LVar4 = parse_revision(ctx,local_40);
      }
    }
LAB_001764bc:
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    LVar4 = get_keyword(ctx,&kw,&word,&word_len);
    lVar8 = kw;
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    bVar11 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
    stmt = any_kw;
    if (((!bVar11) && (*local_b8 != (lysp_ext_instance *)0x0)) &&
       (LVar4 = ly_set_add(&ctx->main_ctx->ext_inst,*local_b8,'\x01',(uint32_t *)0x0),
       LVar4 != LY_SUCCESS)) {
      return LVar4;
    }
  } while( true );
}

Assistant:

LY_ERR
parse_module(struct lysp_yang_ctx *ctx, struct lysp_module *mod)
{
    LY_ERR ret = 0;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw, prev_kw = 0;
    enum yang_module_stmt mod_stmt = Y_MOD_MODULE_HEADER;
    const struct lysp_submodule *dup;

    mod->is_submod = 0;

    /* module name */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, mod->mod->name, word, word_len, ret, cleanup);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {

#define CHECK_ORDER(SECTION) \
        if (mod_stmt > SECTION) {\
            LOGVAL_PARSER(ctx, LY_VCODE_INORD, lyplg_ext_stmt2str(kw), lyplg_ext_stmt2str(prev_kw)); return LY_EVALID;\
        } mod_stmt = SECTION

        switch (kw) {
        /* module header */
        case LY_STMT_NAMESPACE:
        case LY_STMT_PREFIX:
            CHECK_ORDER(Y_MOD_MODULE_HEADER);
            break;
        case LY_STMT_YANG_VERSION:
            CHECK_ORDER(Y_MOD_MODULE_HEADER);
            break;
        /* linkage */
        case LY_STMT_INCLUDE:
        case LY_STMT_IMPORT:
            CHECK_ORDER(Y_MOD_LINKAGE);
            break;
        /* meta */
        case LY_STMT_ORGANIZATION:
        case LY_STMT_CONTACT:
        case LY_STMT_DESCRIPTION:
        case LY_STMT_REFERENCE:
            CHECK_ORDER(Y_MOD_META);
            break;

        /* revision */
        case LY_STMT_REVISION:
            CHECK_ORDER(Y_MOD_REVISION);
            break;
        /* body */
        case LY_STMT_ANYDATA:
        case LY_STMT_ANYXML:
        case LY_STMT_AUGMENT:
        case LY_STMT_CHOICE:
        case LY_STMT_CONTAINER:
        case LY_STMT_DEVIATION:
        case LY_STMT_EXTENSION:
        case LY_STMT_FEATURE:
        case LY_STMT_GROUPING:
        case LY_STMT_IDENTITY:
        case LY_STMT_LEAF:
        case LY_STMT_LEAF_LIST:
        case LY_STMT_LIST:
        case LY_STMT_NOTIFICATION:
        case LY_STMT_RPC:
        case LY_STMT_TYPEDEF:
        case LY_STMT_USES:
            mod_stmt = Y_MOD_BODY;
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            /* no place in the statement order defined */
            break;
        default:
            /* error handled in the next switch */
            break;
        }
#undef CHECK_ORDER

        prev_kw = kw;
        switch (kw) {
        /* module header */
        case LY_STMT_YANG_VERSION:
            LY_CHECK_RET(parse_yangversion(ctx, mod));
            break;
        case LY_STMT_NAMESPACE:
            LY_CHECK_RET(parse_text_field(ctx, mod, LY_STMT_NAMESPACE, 0, &mod->mod->ns, Y_STR_ARG, NULL, &mod->exts));
            break;
        case LY_STMT_PREFIX:
            LY_CHECK_RET(parse_text_field(ctx, mod->mod->prefix, LY_STMT_PREFIX, 0, &mod->mod->prefix, Y_IDENTIF_ARG,
                    NULL, &mod->exts));
            break;

        /* linkage */
        case LY_STMT_INCLUDE:
            LY_CHECK_RET(parse_include(ctx, mod->mod->name, &mod->includes));
            break;
        case LY_STMT_IMPORT:
            LY_CHECK_RET(parse_import(ctx, mod->mod->prefix, &mod->imports));
            break;

        /* meta */
        case LY_STMT_ORGANIZATION:
            LY_CHECK_RET(parse_text_field(ctx, mod, LY_STMT_ORGANIZATION, 0, &mod->mod->org, Y_STR_ARG, NULL, &mod->exts));
            break;
        case LY_STMT_CONTACT:
            LY_CHECK_RET(parse_text_field(ctx, mod, LY_STMT_CONTACT, 0, &mod->mod->contact, Y_STR_ARG, NULL, &mod->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, mod->mod->dsc, LY_STMT_DESCRIPTION, 0, &mod->mod->dsc, Y_STR_ARG, NULL,
                    &mod->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, mod->mod->ref, LY_STMT_REFERENCE, 0, &mod->mod->ref, Y_STR_ARG, NULL,
                    &mod->exts));
            break;

        /* revision */
        case LY_STMT_REVISION:
            LY_CHECK_RET(parse_revision(ctx, &mod->revs));
            break;

        /* body */
        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "module");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(parse_any(ctx, kw, NULL, &mod->data));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(parse_choice(ctx, NULL, &mod->data));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(parse_container(ctx, NULL, &mod->data));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(parse_leaf(ctx, NULL, &mod->data));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(parse_leaflist(ctx, NULL, &mod->data));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(parse_list(ctx, NULL, &mod->data));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(parse_uses(ctx, NULL, &mod->data));
            break;

        case LY_STMT_AUGMENT:
            LY_CHECK_RET(parse_augment(ctx, NULL, &mod->augments));
            break;
        case LY_STMT_DEVIATION:
            LY_CHECK_RET(parse_deviation(ctx, &mod->deviations));
            break;
        case LY_STMT_EXTENSION:
            LY_CHECK_RET(parse_extension(ctx, &mod->extensions));
            break;
        case LY_STMT_FEATURE:
            LY_CHECK_RET(parse_feature(ctx, &mod->features));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(parse_grouping(ctx, NULL, &mod->groupings));
            break;
        case LY_STMT_IDENTITY:
            LY_CHECK_RET(parse_identity(ctx, &mod->identities));
            break;
        case LY_STMT_NOTIFICATION:
            LY_CHECK_RET(parse_notif(ctx, NULL, &mod->notifs));
            break;
        case LY_STMT_RPC:
            LY_CHECK_RET(parse_action(ctx, NULL, &mod->rpcs));
            break;
        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(parse_typedef(ctx, NULL, &mod->typedefs));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, mod, LY_STMT_MODULE, 0, &mod->exts));
            break;

        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "module");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, mod->exts, ret, cleanup);
    }

    /* mandatory substatements */
    if (!mod->mod->ns) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "namespace", "module");
        return LY_EVALID;
    } else if (!mod->mod->prefix) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "prefix", "module");
        return LY_EVALID;
    }

    /* submodules share the namespace with the module names, so there must not be
     * a submodule of the same name in the context, no need for revision matching */
    dup = ly_ctx_get_submodule_latest(PARSER_CTX(ctx), mod->mod->name);
    if (dup) {
        LOGVAL_PARSER(ctx, LY_VCODE_NAME2_COL, "module", "submodule", mod->mod->name);
        return LY_EVALID;
    }

cleanup:
    return ret;
}